

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O1

int emit_indname_block(nghttp2_bufs *bufs,size_t idx,nghttp2_nv *nv,int indexing_mode)

{
  size_t prefix;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong len;
  ulong n;
  uint8_t sb [16];
  uint8_t local_48 [24];
  
  prefix = (ulong)(indexing_mode == 0) * 2 + 4;
  n = idx + 1;
  uVar4 = (ulong)(uint)~(-1 << (sbyte)prefix);
  len = 1;
  uVar3 = n - uVar4;
  if ((uVar4 <= n) && (len = 2, 0x7f < uVar3)) {
    do {
      len = len + 1;
      bVar1 = 0x3fff < uVar3;
      uVar3 = uVar3 >> 7;
    } while (bVar1);
  }
  iVar2 = -0x20b;
  if (len < 0x11) {
    local_48[0] = pack_first_byte(indexing_mode);
    encode_length(local_48,n,prefix);
    iVar2 = nghttp2_bufs_add(bufs,local_48,len);
    if (iVar2 == 0) {
      iVar2 = emit_string(bufs,nv->value,nv->valuelen);
    }
  }
  return iVar2;
}

Assistant:

static int emit_indname_block(nghttp2_bufs *bufs, size_t idx,
                              const nghttp2_nv *nv, int indexing_mode) {
  int rv;
  uint8_t *bufp;
  size_t blocklen;
  uint8_t sb[16];
  size_t prefixlen;

  if (indexing_mode == NGHTTP2_HD_WITH_INDEXING) {
    prefixlen = 6;
  } else {
    prefixlen = 4;
  }

  DEBUGF("deflatehd: emit indname index=%zu, valuelen=%zu, indexing_mode=%d\n",
         idx, nv->valuelen, indexing_mode);

  blocklen = count_encoded_length(idx + 1, prefixlen);

  if (sizeof(sb) < blocklen) {
    return NGHTTP2_ERR_HEADER_COMP;
  }

  bufp = sb;

  *bufp = pack_first_byte(indexing_mode);

  encode_length(bufp, idx + 1, prefixlen);

  rv = nghttp2_bufs_add(bufs, sb, blocklen);
  if (rv != 0) {
    return rv;
  }

  rv = emit_string(bufs, nv->value, nv->valuelen);
  if (rv != 0) {
    return rv;
  }

  return 0;
}